

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::AddVariableDefinition(cmCTest *this,string *arg)

{
  bool bVar1;
  pointer pPVar2;
  mapped_type *this_00;
  CacheEntryType local_64;
  undefined1 local_60 [4];
  CacheEntryType type;
  string value;
  string name;
  string *arg_local;
  cmCTest *this_local;
  
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  local_64 = UNINITIALIZED;
  bVar1 = cmake::ParseCacheEntry
                    (arg,(string *)(value.field_2._M_local_buf + 8),(string *)local_60,&local_64);
  if (bVar1) {
    pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&pPVar2->Definitions,(key_type *)((long)&value.field_2 + 8));
    std::__cxx11::string::operator=((string *)this_00,(string *)local_60);
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return bVar1;
}

Assistant:

bool cmCTest::AddVariableDefinition(const std::string& arg)
{
  std::string name;
  std::string value;
  cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;

  if (cmake::ParseCacheEntry(arg, name, value, type)) {
    this->Impl->Definitions[name] = value;
    return true;
  }

  return false;
}